

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitSwitch(InternalAnalyzer *this,Switch *curr)

{
  ArenaVector<wasm::Name> *pAVar1;
  Name *pNVar2;
  undefined1 auStack_58 [8];
  Name name;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  __begin2.parent = (ArenaVector<wasm::Name> *)0x0;
  pAVar1 = *(ArenaVector<wasm::Name> **)(curr + 0x18);
  name.super_IString.str._M_str = (char *)curr;
  local_40 = (undefined1  [8])(curr + 0x10);
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])(curr + 0x10)))) {
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)local_40);
    auStack_58 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)&this->parent->breakTargets,(Name *)auStack_58);
    __begin2.parent = __begin2.parent + 1;
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->parent->breakTargets,(Name *)(name.super_IString.str._M_str + 0x30));
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
      for (auto name : curr->targets) {
        parent.breakTargets.insert(name);
      }
      parent.breakTargets.insert(curr->default_);
    }